

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidget.cpp
# Opt level: O3

void QWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QWidgetPrivate *pQVar6;
  QLocale QVar7;
  char16_t *pcVar8;
  QArrayData *pQVar9;
  qreal qVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  int *piVar14;
  QSize QVar15;
  QPalette *pQVar16;
  ulong uVar17;
  undefined1 uVar18;
  int iVar19;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar20;
  ulong uVar21;
  QWidgetData *pQVar22;
  undefined8 uVar23;
  QRect *this;
  InputMethodQuery query;
  WidgetAttribute attribute;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *r;
  long lVar24;
  long in_FS_OFFSET;
  QRect QVar25;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  QWidgetData *local_28;
  QWidgetData *local_18;
  
  local_18 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_38._8_8_ = _a[1];
      iVar19 = 0;
      goto LAB_00311119;
    case 1:
      local_38._8_8_ = _a[1];
      iVar19 = 1;
      goto LAB_00311119;
    case 2:
      local_38._8_8_ = _a[1];
      iVar19 = 2;
      goto LAB_00311119;
    case 3:
      local_38._8_8_ = _a[1];
      iVar19 = 3;
LAB_00311119:
      local_38._0_8_ = (QLocale)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar19,(void **)local_38);
      goto switchD_00310d3a_caseD_4;
    case 4:
      bVar12 = *_a[1];
LAB_00311733:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
LAB_00311747:
        setEnabled((QWidget *)_o,(bool)bVar12);
        return;
      }
      break;
    case 5:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_18) break;
      bVar12 = *_a[1] ^ 1;
      goto LAB_00311747;
    case 6:
      uVar18 = *_a[1];
LAB_0031152b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowModified((QWidget *)_o,(bool)uVar18);
        return;
      }
      break;
    case 7:
      r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)_a[1];
switchD_00310d9a_caseD_2a:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowTitle((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 8:
      r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)_a[1];
switchD_00310d9a_caseD_38:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setStyleSheet((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 9:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setFocus((QWidget *)_o,OtherFocusReason);
        return;
      }
      break;
    case 10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        update((QWidget *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        repaint((QWidget *)_o);
        return;
      }
      break;
    case 0xc:
      pQVar22 = (QWidgetData *)CONCAT71(0x663d,*_a[1]);
LAB_003115cf:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x68);
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_003115ea;
    case 0xd:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x68);
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_18) break;
      pQVar22 = (QWidgetData *)(CONCAT71(0x663d,*_a[1]) ^ 1);
LAB_003115ea:
      uVar17 = (ulong)pQVar22 & 0xff;
LAB_003115f0:
      (*UNRECOVERED_JUMPTABLE)(_o,uVar17,pQVar22,UNRECOVERED_JUMPTABLE);
      return;
    case 0xe:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        show((QWidget *)_o);
        return;
      }
      break;
    case 0xf:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x68);
      pQVar22 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
      if (pQVar22 != local_18) break;
      uVar17 = 0;
      goto LAB_003115f0;
    case 0x10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showMinimized((QWidget *)_o);
        return;
      }
      break;
    case 0x11:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showMaximized((QWidget *)_o);
        return;
      }
      break;
    case 0x12:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showFullScreen((QWidget *)_o);
        return;
      }
      break;
    case 0x13:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        showNormal((QWidget *)_o);
        return;
      }
      break;
    case 0x14:
      iVar19 = QWidgetPrivate::close(*(QWidgetPrivate **)(_o + 8),0x663b98);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(char *)*_a = (char)iVar19;
      }
      goto switchD_00310d3a_caseD_4;
    case 0x15:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        raise((QWidget *)_o,0x663b98);
        return;
      }
      break;
    case 0x16:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        lower((QWidget *)_o);
        return;
      }
      break;
    case 0x17:
      query = *_a[1];
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
LAB_003112ab:
        updateMicroFocus((QWidget *)_o,query);
        return;
      }
      break;
    case 0x18:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        query = ImQueryAll;
        goto LAB_003112ab;
      }
      break;
    case 0x19:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::_q_showIfNotHidden(*(QWidgetPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x1a:
      this = (QRect *)*_a;
      if (this != (QRect *)0x0) {
        QVar15 = (QSize)QWidgetPrivate::windowHandle(*(QWidgetPrivate **)(_o + 8),Closest);
        goto LAB_00311e14;
      }
      goto switchD_00310d3a_caseD_4;
    case 0x1b:
      goto LAB_003112e1;
    case 0x1c:
      local_48._0_8_ = (QIconPrivate *)0x0;
      local_48._8_8_ = 0xfffffffefffffffe;
LAB_003112e1:
      local_28 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      grab((QWidget *)local_38,(QRect *)_o);
      if ((QPixmap *)*_a != (QPixmap *)0x0) {
        QPixmap::operator=((QPixmap *)*_a,(QPixmap *)local_38);
      }
      QPixmap::~QPixmap((QPixmap *)local_38);
    default:
      goto switchD_00310d3a_caseD_4;
    }
    goto LAB_00311f6c;
  case ReadProperty:
    if (0x3b < (uint)_id) goto switchD_00310d3a_caseD_4;
    break;
  case WriteProperty:
    if (0x3a < _id - 1U) goto switchD_00310d3a_caseD_4;
    r = (anon_union_4_2_313b0b05_for_QSizePolicy_1 *)*_a;
    switch(_id) {
    case 1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowModality((QWidget *)_o,r->data);
        return;
      }
      break;
    case 2:
      bVar12 = *(byte *)r;
      goto LAB_00311733;
    case 3:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setGeometry((QWidget *)_o,(QRect *)&r->bits);
        return;
      }
      break;
    default:
      goto switchD_00310d3a_caseD_4;
    case 8:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        move((QWidget *)_o,(QPoint *)&r->bits);
        return;
      }
      break;
    case 10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        resize((QWidget *)_o,(QSize *)&r->bits);
        return;
      }
      break;
    case 0x10:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setSizePolicy((QWidget *)_o,
                      (QSizePolicy)*(anon_union_4_2_313b0b05_for_QSizePolicy_1 *)&r->bits);
        return;
      }
      break;
    case 0x11:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumSize((QWidget *)_o,r->data,r[1].data);
        return;
      }
      break;
    case 0x12:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumSize((QWidget *)_o,r->data,r[1].data);
        return;
      }
      break;
    case 0x13:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumWidth((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x14:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMinimumHeight((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x15:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumWidth((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x16:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumHeight((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x17:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setSizeIncrement((QWidget *)_o,r->data,r[1].data);
        return;
      }
      break;
    case 0x18:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setBaseSize((QWidget *)_o,r->data,r[1].data);
        return;
      }
      break;
    case 0x19:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setPalette((QWidget *)_o,(QPalette *)&r->bits);
        return;
      }
      break;
    case 0x1a:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setFont((QWidget *)_o,(QFont *)&r->bits);
        return;
      }
      break;
    case 0x1b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setCursor((QWidget *)_o,(QCursor *)&r->bits);
        return;
      }
      break;
    case 0x1c:
      uVar18 = *(undefined1 *)r;
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        attribute = WA_MouseTracking;
LAB_0031182d:
        setAttribute((QWidget *)_o,attribute,(bool)uVar18);
        return;
      }
      break;
    case 0x1d:
      uVar18 = *(undefined1 *)r;
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        attribute = WA_TabletTracking;
        goto LAB_0031182d;
      }
      break;
    case 0x1f:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setFocusPolicy((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x21:
      *(uint *)(*(long *)(_o + 0x20) + 0x10) =
           *(uint *)(*(long *)(_o + 0x20) + 0x10) & 0xffff1fff | (r->data & 7) << 0xd;
      goto switchD_00310d3a_caseD_4;
    case 0x22:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setUpdatesEnabled((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x23:
      pQVar22 = (QWidgetData *)
                CONCAT71((int7)((ulong)((long)&switchD_00310d9a::switchdataD_00663bb0 +
                                       (long)(int)(&switchD_00310d9a::switchdataD_00663bb0)
                                                  [_id - 1U]) >> 8),*(undefined1 *)r);
      goto LAB_003115cf;
    case 0x29:
      uVar18 = *(undefined1 *)r;
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        attribute = WA_AcceptDrops;
        goto LAB_0031182d;
      }
      break;
    case 0x2a:
      goto switchD_00310d9a_caseD_2a;
    case 0x2b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowIcon((QWidget *)_o,(QIcon *)&r->bits);
        return;
      }
      break;
    case 0x2c:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowIconText((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x2d:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowOpacity((QWidget *)_o,*(qreal *)r);
        return;
      }
      break;
    case 0x2e:
      uVar18 = *(undefined1 *)r;
      goto LAB_0031152b;
    case 0x2f:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setToolTip((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x30:
      ((anon_union_4_2_313b0b05_for_QSizePolicy_1 *)(*(long *)(_o + 8) + 0x100))->bits = *(Bits *)r;
      goto switchD_00310d3a_caseD_4;
    case 0x31:
      lVar24 = 0x108;
      goto LAB_003118a7;
    case 0x32:
      lVar24 = 0x120;
LAB_003118a7:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QString::operator=((QString *)(lVar24 + *(long *)(_o + 8)),(QString *)r);
        return;
      }
      break;
    case 0x33:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAccessibleName((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x34:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAccessibleDescription((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x35:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAccessibleIdentifier((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x36:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setLayoutDirection((QWidget *)_o,r->data);
        return;
      }
      break;
    case 0x37:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setAutoFillBackground((QWidget *)_o,*(bool *)r);
        return;
      }
      break;
    case 0x38:
      goto switchD_00310d9a_caseD_38;
    case 0x39:
      pQVar6 = *(QWidgetPrivate **)(_o + 8);
      if ((pQVar6->high_attributes[1] >> 0x17 & 1) == 0) {
        pQVar6->high_attributes[1] = pQVar6->high_attributes[1] | 0x800000;
      }
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::setLocale_helper(pQVar6,(QLocale *)&r->bits,false);
        return;
      }
      break;
    case 0x3a:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setWindowFilePath((QWidget *)_o,(QString *)&r->bits);
        return;
      }
      break;
    case 0x3b:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        setInputMethodHints((QWidget *)_o,
                            (QFlagsStorageHelper<Qt::InputMethodHint,_4>)
                            *(QFlagsStorageHelper<Qt::InputMethodHint,_4> *)&r->bits);
        return;
      }
    }
    goto LAB_00311f6c;
  case ResetProperty:
    if (_id == 0x39) {
      pQVar6 = *(QWidgetPrivate **)(_o + 8);
      if ((pQVar6->high_attributes[1] >> 0x17 & 1) != 0) {
        pQVar6->high_attributes[1] = pQVar6->high_attributes[1] & 0xff7fffff;
      }
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::resolveLocale(pQVar6);
        return;
      }
      goto LAB_00311f6c;
    }
    if (_id == 0x36) {
      pQVar6 = *(QWidgetPrivate **)(_o + 8);
      if ((pQVar6->high_attributes[0] >> 0x19 & 1) != 0) {
        pQVar6->high_attributes[0] = pQVar6->high_attributes[0] & 0xfdffffff;
      }
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetPrivate::resolveLayoutDirection(pQVar6);
        return;
      }
      goto LAB_00311f6c;
    }
    if (_id == 0x1b) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
        unsetCursor((QWidget *)_o);
        return;
      }
      goto LAB_00311f6c;
    }
  default:
    goto switchD_00310d3a_caseD_4;
  case IndexOfMethod:
    UNRECOVERED_JUMPTABLE = *_a[1];
    lVar24 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE == windowTitleChanged && lVar24 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (UNRECOVERED_JUMPTABLE == windowIconChanged && lVar24 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (UNRECOVERED_JUMPTABLE == windowIconTextChanged && lVar24 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (UNRECOVERED_JUMPTABLE == customContextMenuRequested && lVar24 == 0) {
      *(undefined4 *)*_a = 3;
    }
    goto switchD_00310d3a_caseD_4;
  }
  this = (QRect *)*_a;
  switch(_id) {
  case 0:
    *(bool *)&(this->x1).m_i = (*(uint *)(*(long *)(_o + 0x20) + 0x10) & 0x30000) != 0;
    break;
  case 1:
    uVar13 = *(ushort *)(*(long *)(_o + 0x20) + 0x12) & 3;
    goto LAB_00311f35;
  case 2:
    bVar12 = ~*(byte *)(*(long *)(_o + 0x20) + 8);
    goto LAB_00311e3d;
  case 3:
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
      uVar20 = *(undefined8 *)(*(long *)(_o + 0x20) + 0x14);
      uVar23 = *(undefined8 *)(*(long *)(_o + 0x20) + 0x1c);
      this->x1 = (Representation)(int)uVar20;
      this->y1 = (Representation)(int)((ulong)uVar20 >> 0x20);
      this->x2 = (Representation)(int)uVar23;
      this->y2 = (Representation)(int)((ulong)uVar23 >> 0x20);
      return;
    }
    goto LAB_00311f6c;
  case 4:
    QVar25 = frameGeometry((QWidget *)_o);
    goto LAB_00311c30;
  case 5:
    QVar25 = normalGeometry((QWidget *)_o);
    goto LAB_00311c30;
  case 6:
    uVar13 = x((QWidget *)_o);
    goto LAB_00311f35;
  case 7:
    uVar13 = y((QWidget *)_o);
    goto LAB_00311f35;
  case 8:
    QVar15 = (QSize)pos((QWidget *)_o);
    goto LAB_00311e14;
  case 9:
    QVar15 = frameSize((QWidget *)_o);
    goto LAB_00311e14;
  case 10:
    lVar24 = *(long *)(_o + 0x20);
    iVar19 = *(int *)(lVar24 + 0x20);
    iVar3 = *(int *)(lVar24 + 0x18);
    this->x1 = (Representation)((*(int *)(lVar24 + 0x1c) - *(int *)(lVar24 + 0x14)) + 1);
    this->y1 = (Representation)((iVar19 - iVar3) + 1);
    break;
  case 0xb:
    iVar19 = *(int *)(*(long *)(_o + 0x20) + 0x1c) - *(int *)(*(long *)(_o + 0x20) + 0x14);
    goto LAB_00311adf;
  case 0xc:
    iVar19 = *(int *)(*(long *)(_o + 0x20) + 0x20) - *(int *)(*(long *)(_o + 0x20) + 0x18);
LAB_00311adf:
    (this->x1).m_i = iVar19 + 1;
    break;
  case 0xd:
    lVar24 = *(long *)(_o + 0x20);
    iVar19 = *(int *)(lVar24 + 0x1c);
    iVar3 = *(int *)(lVar24 + 0x20);
    iVar4 = *(int *)(lVar24 + 0x14);
    iVar5 = *(int *)(lVar24 + 0x18);
    this->x1 = 0;
    this->y1 = 0;
    this->x2 = (Representation)(iVar19 - iVar4);
    this->y2 = (Representation)(iVar3 - iVar5);
    break;
  case 0xe:
    QVar25 = childrenRect((QWidget *)_o);
LAB_00311c30:
    *this = QVar25;
    break;
  case 0xf:
    childrenRegion((QWidget *)local_38);
    this->x1 = (Representation)local_38._0_4_;
    this->y1 = (Representation)local_38._4_4_;
    local_38._0_8_ = *(QLocale *)this;
    QRegion::~QRegion((QRegion *)local_38);
    break;
  case 0x10:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x208);
    goto LAB_00311f35;
  case 0x11:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
      QVar15.wd.m_i = 0;
      QVar15.ht.m_i = 0;
    }
    else {
      QVar15 = *(QSize *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x60);
    }
    goto LAB_00311e14;
  case 0x12:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
      QVar15.wd.m_i = 0xffffff;
      QVar15.ht.m_i = 0xffffff;
    }
    else {
      QVar15 = *(QSize *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x68);
    }
    goto LAB_00311e14;
  case 0x13:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
LAB_00311f33:
      uVar13 = 0;
    }
    else {
      uVar13 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x60);
    }
    goto LAB_00311f35;
  case 0x14:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) goto LAB_00311f33;
    uVar13 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 100);
    goto LAB_00311f35;
  case 0x15:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) {
LAB_00311f2c:
      uVar13 = 0xffffff;
    }
    else {
      uVar13 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x68);
    }
    goto LAB_00311f35;
  case 0x16:
    if (*(long *)(*(long *)(_o + 8) + 0x78) == 0) goto LAB_00311f2c;
    uVar13 = *(uint *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x6c);
    goto LAB_00311f35;
  case 0x17:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) == 0) ||
       (lVar24 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar24 == 0))
    goto LAB_00311e0d;
    sVar1 = *(short *)(lVar24 + 0x88);
    sVar2 = *(short *)(lVar24 + 0x8a);
LAB_00311e05:
    uVar17 = (long)sVar2 << 0x20;
    uVar21 = (ulong)(uint)(int)sVar1;
    goto LAB_00311e11;
  case 0x18:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) != 0) &&
       (lVar24 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar24 != 0)) {
      sVar1 = *(short *)(lVar24 + 0x8c);
      sVar2 = *(short *)(lVar24 + 0x8e);
      goto LAB_00311e05;
    }
LAB_00311e0d:
    uVar17 = 0;
    uVar21 = 0;
LAB_00311e11:
    QVar15 = (QSize)(uVar17 | uVar21);
    goto LAB_00311e14;
  case 0x19:
    pQVar16 = palette((QWidget *)_o);
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
      QPalette::operator=((QPalette *)this,pQVar16);
      return;
    }
    goto LAB_00311f6c;
  case 0x1a:
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
      QFont::operator=((QFont *)this,(QFont *)(*(long *)(_o + 0x20) + 0x38));
      return;
    }
    goto LAB_00311f6c;
  case 0x1b:
    cursor((QWidget *)local_48);
    uVar20 = local_48._0_8_;
    local_48._0_8_ = (QIconPrivate *)0x0;
    uVar23 = local_48._0_8_;
    local_38._0_8_ = *(undefined8 *)this;
    local_48._0_4_ = (undefined4)uVar20;
    local_48._4_4_ = SUB84(uVar20,4);
    this->x1 = (Representation)local_48._0_4_;
    this->y1 = (Representation)local_48._4_4_;
    local_48._0_8_ = uVar23;
    QCursor::~QCursor((QCursor *)local_38);
    QCursor::~QCursor((QCursor *)local_48);
    break;
  case 0x1c:
    bVar12 = *(byte *)(*(long *)(_o + 0x20) + 8);
    goto LAB_00311e3a;
  case 0x1d:
    bVar12 = *(byte *)(*(long *)(_o + 8) + 0x24c);
    goto LAB_00311e2f;
  case 0x1e:
    bVar11 = isActiveWindow((QWidget *)_o);
    goto LAB_00311e3f;
  case 0x1f:
    uVar13 = *(uint *)(*(long *)(_o + 0x20) + 0x10) >> 4 & 0xf;
    goto LAB_00311f35;
  case 0x20:
    bVar11 = hasFocus((QWidget *)_o);
    goto LAB_00311e3f;
  case 0x21:
    uVar13 = *(uint *)(*(long *)(_o + 0x20) + 0x10) >> 0xd & 7;
    goto LAB_00311f35;
  case 0x22:
    *(bool *)&(this->x1).m_i = (*(uint *)(*(long *)(_o + 0x20) + 8) >> 10 & 1) == 0;
    break;
  case 0x23:
    bVar12 = (byte)(*(uint *)(*(long *)(_o + 0x20) + 8) >> 0xf);
    goto LAB_00311ec7;
  case 0x24:
    bVar12 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
    goto LAB_00311e3d;
  case 0x25:
    bVar12 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
LAB_00311e2f:
    bVar12 = bVar12 >> 1;
    goto LAB_00311e3d;
  case 0x26:
    bVar12 = *(byte *)(*(long *)(_o + 0x20) + 0x10);
LAB_00311e3a:
    bVar12 = bVar12 >> 2;
LAB_00311e3d:
    bVar11 = (bool)(bVar12 & 1);
LAB_00311e3f:
    *(bool *)&(this->x1).m_i = bVar11;
    break;
  case 0x27:
    QVar15 = (QSize)(**(code **)(*(long *)_o + 0x70))(_o);
    goto LAB_00311e14;
  case 0x28:
    QVar15 = (QSize)(**(code **)(*(long *)_o + 0x78))(_o);
LAB_00311e14:
    this->x1 = (Representation)QVar15.wd.m_i;
    this->y1 = (Representation)QVar15.ht.m_i;
    break;
  case 0x29:
    bVar12 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x244) >> 0xe);
    goto LAB_00311ec7;
  case 0x2a:
    windowTitle((QString *)local_38,(QWidget *)_o);
    QVar7 = *(QLocale *)this;
    this->x1 = (Representation)local_38._0_4_;
    this->y1 = (Representation)local_38._4_4_;
    pcVar8 = *(char16_t **)&this->x2;
    this->x2 = (Representation)local_38._8_4_;
    this->y2 = (Representation)local_38._12_4_;
    pQVar22 = *(QWidgetData **)(this + 1);
    *(QWidgetData **)(this + 1) = local_28;
    local_38._0_8_ = QVar7;
    local_38._8_8_ = pcVar8;
    local_28 = pQVar22;
    if (QVar7 != (QLocale)0x0) {
      LOCK();
      *(int *)QVar7 = *(int *)QVar7 + -1;
      UNLOCK();
      if (*(int *)QVar7 == 0) {
        QArrayData::deallocate((QArrayData *)QVar7,2,0x10);
      }
    }
    break;
  case 0x2b:
    windowIcon((QWidget *)local_48);
    uVar20 = local_48._0_8_;
    local_48._0_8_ = (QIconPrivate *)0x0;
    uVar23 = local_48._0_8_;
    local_38._0_8_ = *(undefined8 *)this;
    local_48._0_4_ = (undefined4)uVar20;
    local_48._4_4_ = SUB84(uVar20,4);
    this->x1 = (Representation)local_48._0_4_;
    this->y1 = (Representation)local_48._4_4_;
    local_48._0_8_ = uVar23;
    QIcon::~QIcon((QIcon *)local_38);
    QIcon::~QIcon((QIcon *)local_48);
    break;
  case 0x2c:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) == 0) ||
       (lVar24 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar24 == 0))
    goto LAB_00311a85;
    piVar14 = *(int **)(lVar24 + 0x40);
    uVar20 = *(undefined8 *)(lVar24 + 0x48);
    uVar23 = *(undefined8 *)(lVar24 + 0x50);
LAB_00311a75:
    if (piVar14 != (int *)0x0) goto LAB_00311eeb;
    piVar14 = (int *)0x0;
    goto LAB_00311eee;
  case 0x2d:
    qVar10 = windowOpacity((QWidget *)_o);
    *(qreal *)this = qVar10;
    break;
  case 0x2e:
    bVar12 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x240) >> 9);
LAB_00311ec7:
    bVar12 = bVar12 & 1;
LAB_00311ec9:
    *(byte *)&(this->x1).m_i = bVar12;
    break;
  case 0x2f:
    lVar24 = *(long *)(_o + 8);
    piVar14 = *(int **)(lVar24 + 0xe8);
    uVar20 = *(undefined8 *)(lVar24 + 0xf0);
    uVar23 = *(undefined8 *)(lVar24 + 0xf8);
    goto LAB_00311ee6;
  case 0x30:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x100);
    goto LAB_00311f35;
  case 0x31:
    lVar24 = *(long *)(_o + 8);
    piVar14 = *(int **)(lVar24 + 0x108);
    uVar20 = *(undefined8 *)(lVar24 + 0x110);
    uVar23 = *(undefined8 *)(lVar24 + 0x118);
    goto LAB_00311ee6;
  case 0x32:
    lVar24 = *(long *)(_o + 8);
    piVar14 = *(int **)(lVar24 + 0x120);
    uVar20 = *(undefined8 *)(lVar24 + 0x128);
    uVar23 = *(undefined8 *)(lVar24 + 0x130);
    goto LAB_00311ee6;
  case 0x33:
    lVar24 = *(long *)(_o + 8);
    piVar14 = *(int **)(lVar24 + 0x138);
    uVar20 = *(undefined8 *)(lVar24 + 0x140);
    uVar23 = *(undefined8 *)(lVar24 + 0x148);
    goto LAB_00311ee6;
  case 0x34:
    lVar24 = *(long *)(_o + 8);
    piVar14 = *(int **)(lVar24 + 0x150);
    uVar20 = *(undefined8 *)(lVar24 + 0x158);
    uVar23 = *(undefined8 *)(lVar24 + 0x160);
    goto LAB_00311ee6;
  case 0x35:
    lVar24 = *(long *)(_o + 8);
    piVar14 = *(int **)(lVar24 + 0x168);
    uVar20 = *(undefined8 *)(lVar24 + 0x170);
    uVar23 = *(undefined8 *)(lVar24 + 0x178);
LAB_00311ee6:
    if (piVar14 != (int *)0x0) {
LAB_00311eeb:
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
LAB_00311eee:
    pQVar9 = *(QArrayData **)this;
    *(int **)this = piVar14;
    this->x2 = (Representation)(int)uVar20;
    this->y2 = (Representation)(int)((ulong)uVar20 >> 0x20);
    this[1].x1 = (Representation)(int)uVar23;
    this[1].y1 = (Representation)(int)((ulong)uVar23 >> 0x20);
    if (pQVar9 != (QArrayData *)0x0) {
      LOCK();
      (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
          QArrayData::deallocate(pQVar9,2,0x10);
          return;
        }
        goto LAB_00311f6c;
      }
    }
    break;
  case 0x36:
    uVar13 = *(uint *)(*(long *)(_o + 8) + 0x240) >> 0x18 & 1;
    goto LAB_00311f35;
  case 0x37:
    if (*(long *)(*(long *)(_o + 8) + 0x78) != 0) {
      bVar12 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x78) + 0x7c) >> 4;
      goto LAB_00311ec7;
    }
    bVar12 = 0;
    goto LAB_00311ec9;
  case 0x38:
    lVar24 = *(long *)(*(long *)(_o + 8) + 0x78);
    if (lVar24 != 0) {
      piVar14 = *(int **)(lVar24 + 0x48);
      uVar20 = *(undefined8 *)(lVar24 + 0x50);
      uVar23 = *(undefined8 *)(lVar24 + 0x58);
      goto LAB_00311a75;
    }
    goto LAB_00311a85;
  case 0x39:
    QLocale::QLocale((QLocale *)local_38,(QLocale *)(*(long *)(_o + 8) + 0x210));
    this->x1 = (Representation)local_38._0_4_;
    this->y1 = (Representation)local_38._4_4_;
    local_38._0_8_ = *(QLocale *)this;
    QLocale::~QLocale((QLocale *)local_38);
    break;
  case 0x3a:
    if ((*(long *)(*(long *)(_o + 8) + 0x78) != 0) &&
       (lVar24 = *(long *)(*(long *)(*(long *)(_o + 8) + 0x78) + 8), lVar24 != 0)) {
      piVar14 = *(int **)(lVar24 + 0x70);
      uVar20 = *(undefined8 *)(lVar24 + 0x78);
      uVar23 = *(undefined8 *)(lVar24 + 0x80);
      goto LAB_00311a75;
    }
LAB_00311a85:
    piVar14 = (int *)0x0;
    uVar20 = 0;
    uVar23 = 0;
    goto LAB_00311eee;
  case 0x3b:
    while (lVar24 = *(long *)(_o + 8), (*(byte *)(lVar24 + 0x253) & 4) != 0) {
      _o = *(QObject **)(*(long *)(*(long *)(lVar24 + 8) + 8) + 0x10);
    }
    uVar13 = *(uint *)(lVar24 + 0xd0);
LAB_00311f35:
    (this->x1).m_i = uVar13;
  }
switchD_00310d3a_caseD_4:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00311f6c:
  __stack_chk_fail();
}

Assistant:

void QWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowTitleChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->windowIconChanged((*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[1]))); break;
        case 2: _t->windowIconTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->customContextMenuRequested((*reinterpret_cast< std::add_pointer_t<QPoint>>(_a[1]))); break;
        case 4: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setDisabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->setWindowModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->setWindowTitle((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setStyleSheet((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFocus(); break;
        case 10: _t->update(); break;
        case 11: _t->repaint(); break;
        case 12: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 13: _t->setHidden((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->show(); break;
        case 15: _t->hide(); break;
        case 16: _t->showMinimized(); break;
        case 17: _t->showMaximized(); break;
        case 18: _t->showFullScreen(); break;
        case 19: _t->showNormal(); break;
        case 20: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: _t->raise(); break;
        case 22: _t->lower(); break;
        case 23: _t->updateMicroFocus((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1]))); break;
        case 24: _t->updateMicroFocus(); break;
        case 25: _t->d_func()->_q_showIfNotHidden(); break;
        case 26: { QWindow* _r = _t->d_func()->_q_closestWindowHandle();
            if (_a[0]) *reinterpret_cast< QWindow**>(_a[0]) = std::move(_r); }  break;
        case 27: { QPixmap _r = _t->grab((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        case 28: { QPixmap _r = _t->grab();
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowTitleChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QIcon & )>(_a, &QWidget::windowIconChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowIconTextChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QPoint & )>(_a, &QWidget::customContextMenuRequested, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        case 1: *reinterpret_cast<Qt::WindowModality*>(_v) = _t->windowModality(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<QRect*>(_v) = _t->geometry(); break;
        case 4: *reinterpret_cast<QRect*>(_v) = _t->frameGeometry(); break;
        case 5: *reinterpret_cast<QRect*>(_v) = _t->normalGeometry(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->x(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->y(); break;
        case 8: *reinterpret_cast<QPoint*>(_v) = _t->pos(); break;
        case 9: *reinterpret_cast<QSize*>(_v) = _t->frameSize(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->size(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->width(); break;
        case 12: *reinterpret_cast<int*>(_v) = _t->height(); break;
        case 13: *reinterpret_cast<QRect*>(_v) = _t->rect(); break;
        case 14: *reinterpret_cast<QRect*>(_v) = _t->childrenRect(); break;
        case 15: *reinterpret_cast<QRegion*>(_v) = _t->childrenRegion(); break;
        case 16: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 17: *reinterpret_cast<QSize*>(_v) = _t->minimumSize(); break;
        case 18: *reinterpret_cast<QSize*>(_v) = _t->maximumSize(); break;
        case 19: *reinterpret_cast<int*>(_v) = _t->minimumWidth(); break;
        case 20: *reinterpret_cast<int*>(_v) = _t->minimumHeight(); break;
        case 21: *reinterpret_cast<int*>(_v) = _t->maximumWidth(); break;
        case 22: *reinterpret_cast<int*>(_v) = _t->maximumHeight(); break;
        case 23: *reinterpret_cast<QSize*>(_v) = _t->sizeIncrement(); break;
        case 24: *reinterpret_cast<QSize*>(_v) = _t->baseSize(); break;
        case 25: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 26: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 27: *reinterpret_cast<QCursor*>(_v) = _t->cursor(); break;
        case 28: *reinterpret_cast<bool*>(_v) = _t->hasMouseTracking(); break;
        case 29: *reinterpret_cast<bool*>(_v) = _t->hasTabletTracking(); break;
        case 30: *reinterpret_cast<bool*>(_v) = _t->isActiveWindow(); break;
        case 31: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 32: *reinterpret_cast<bool*>(_v) = _t->hasFocus(); break;
        case 33: *reinterpret_cast<Qt::ContextMenuPolicy*>(_v) = _t->contextMenuPolicy(); break;
        case 34: *reinterpret_cast<bool*>(_v) = _t->updatesEnabled(); break;
        case 35: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 36: *reinterpret_cast<bool*>(_v) = _t->isMinimized(); break;
        case 37: *reinterpret_cast<bool*>(_v) = _t->isMaximized(); break;
        case 38: *reinterpret_cast<bool*>(_v) = _t->isFullScreen(); break;
        case 39: *reinterpret_cast<QSize*>(_v) = _t->sizeHint(); break;
        case 40: *reinterpret_cast<QSize*>(_v) = _t->minimumSizeHint(); break;
        case 41: *reinterpret_cast<bool*>(_v) = _t->acceptDrops(); break;
        case 42: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 43: *reinterpret_cast<QIcon*>(_v) = _t->windowIcon(); break;
        case 44: *reinterpret_cast<QString*>(_v) = _t->windowIconText(); break;
        case 45: *reinterpret_cast<double*>(_v) = _t->windowOpacity(); break;
        case 46: *reinterpret_cast<bool*>(_v) = _t->isWindowModified(); break;
        case 47: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 48: *reinterpret_cast<int*>(_v) = _t->toolTipDuration(); break;
        case 49: *reinterpret_cast<QString*>(_v) = _t->statusTip(); break;
        case 50: *reinterpret_cast<QString*>(_v) = _t->whatsThis(); break;
        case 51: *reinterpret_cast<QString*>(_v) = _t->accessibleName(); break;
        case 52: *reinterpret_cast<QString*>(_v) = _t->accessibleDescription(); break;
        case 53: *reinterpret_cast<QString*>(_v) = _t->accessibleIdentifier(); break;
        case 54: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 55: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 56: *reinterpret_cast<QString*>(_v) = _t->styleSheet(); break;
        case 57: *reinterpret_cast<QLocale*>(_v) = _t->locale(); break;
        case 58: *reinterpret_cast<QString*>(_v) = _t->windowFilePath(); break;
        case 59: *reinterpret_cast<Qt::InputMethodHints*>(_v) = _t->inputMethodHints(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setWindowModality(*reinterpret_cast<Qt::WindowModality*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setGeometry(*reinterpret_cast<QRect*>(_v)); break;
        case 8: _t->move(*reinterpret_cast<QPoint*>(_v)); break;
        case 10: _t->resize(*reinterpret_cast<QSize*>(_v)); break;
        case 16: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 17: _t->setMinimumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 18: _t->setMaximumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 19: _t->setMinimumWidth(*reinterpret_cast<int*>(_v)); break;
        case 20: _t->setMinimumHeight(*reinterpret_cast<int*>(_v)); break;
        case 21: _t->setMaximumWidth(*reinterpret_cast<int*>(_v)); break;
        case 22: _t->setMaximumHeight(*reinterpret_cast<int*>(_v)); break;
        case 23: _t->setSizeIncrement(*reinterpret_cast<QSize*>(_v)); break;
        case 24: _t->setBaseSize(*reinterpret_cast<QSize*>(_v)); break;
        case 25: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 26: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 27: _t->setCursor(*reinterpret_cast<QCursor*>(_v)); break;
        case 28: _t->setMouseTracking(*reinterpret_cast<bool*>(_v)); break;
        case 29: _t->setTabletTracking(*reinterpret_cast<bool*>(_v)); break;
        case 31: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 33: _t->setContextMenuPolicy(*reinterpret_cast<Qt::ContextMenuPolicy*>(_v)); break;
        case 34: _t->setUpdatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 35: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 41: _t->setAcceptDrops(*reinterpret_cast<bool*>(_v)); break;
        case 42: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 43: _t->setWindowIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 44: _t->setWindowIconText(*reinterpret_cast<QString*>(_v)); break;
        case 45: _t->setWindowOpacity(*reinterpret_cast<double*>(_v)); break;
        case 46: _t->setWindowModified(*reinterpret_cast<bool*>(_v)); break;
        case 47: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 48: _t->setToolTipDuration(*reinterpret_cast<int*>(_v)); break;
        case 49: _t->setStatusTip(*reinterpret_cast<QString*>(_v)); break;
        case 50: _t->setWhatsThis(*reinterpret_cast<QString*>(_v)); break;
        case 51: _t->setAccessibleName(*reinterpret_cast<QString*>(_v)); break;
        case 52: _t->setAccessibleDescription(*reinterpret_cast<QString*>(_v)); break;
        case 53: _t->setAccessibleIdentifier(*reinterpret_cast<QString*>(_v)); break;
        case 54: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 55: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 56: _t->setStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 57: _t->setLocale(*reinterpret_cast<QLocale*>(_v)); break;
        case 58: _t->setWindowFilePath(*reinterpret_cast<QString*>(_v)); break;
        case 59: _t->setInputMethodHints(*reinterpret_cast<Qt::InputMethodHints*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 27: _t->unsetCursor(); break;
        case 54: _t->unsetLayoutDirection(); break;
        case 57: _t->unsetLocale(); break;
        default: break;
        }
    }
}